

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

void __thiscall qpdf::Tokenizer::inStringEscape(Tokenizer *this,char ch)

{
  char ch_local;
  Tokenizer *this_local;
  
  this->state = st_in_string;
  switch(ch) {
  case '\n':
    break;
  default:
    std::__cxx11::string::operator+=((string *)&this->val,ch);
    break;
  case '\r':
    this->state = st_string_after_cr;
    break;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
    this->state = st_char_code;
    this->char_code = 0;
    this->digit_count = 0;
    inCharCode(this,ch);
    break;
  case 'b':
    std::__cxx11::string::operator+=((string *)&this->val,'\b');
    break;
  case 'f':
    std::__cxx11::string::operator+=((string *)&this->val,'\f');
    break;
  case 'n':
    std::__cxx11::string::operator+=((string *)&this->val,'\n');
    break;
  case 'r':
    std::__cxx11::string::operator+=((string *)&this->val,'\r');
    break;
  case 't':
    std::__cxx11::string::operator+=((string *)&this->val,'\t');
  }
  return;
}

Assistant:

void
Tokenizer::inStringEscape(char ch)
{
    state = st_in_string;
    switch (ch) {
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
        state = st_char_code;
        char_code = 0;
        digit_count = 0;
        inCharCode(ch);
        return;

    case 'n':
        val += '\n';
        return;

    case 'r':
        val += '\r';
        return;

    case 't':
        val += '\t';
        return;

    case 'b':
        val += '\b';
        return;

    case 'f':
        val += '\f';
        return;

    case '\n':
        return;

    case '\r':
        state = st_string_after_cr;
        return;

    default:
        // PDF spec says backslash is ignored before anything else
        val += ch;
        return;
    }
}